

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  int *piVar1;
  uint uVar2;
  nk_rune *pnVar3;
  int iVar4;
  ulong uVar5;
  nk_font_config *pnVar6;
  ulong uVar7;
  
  if (font != (nk_font *)0x0) {
    iVar4 = 0;
    if (font->glyphs != (nk_font_glyph *)0x0) {
      pnVar6 = font->config;
      do {
        pnVar3 = pnVar6->range;
        uVar7 = 0;
        if (pnVar3 != (nk_rune *)0x0) {
          do {
            piVar1 = (int *)((long)pnVar3 + uVar7);
            uVar7 = uVar7 + 4;
          } while (*piVar1 != 0);
          uVar7 = (uVar7 >> 2) - ((long)uVar7 >> 0x3f) >> 1;
        }
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            uVar2 = pnVar3[uVar5 * 2];
            if (unicode <= pnVar3[uVar5 * 2 + 1] && uVar2 <= unicode) {
              return font->glyphs + ((iVar4 + unicode) - uVar2);
            }
            iVar4 = (iVar4 - uVar2) + pnVar3[uVar5 * 2 + 1] + 1;
            uVar5 = uVar5 + 1;
          } while ((uVar7 & 0xffffffff) != uVar5);
        }
        pnVar6 = pnVar6->n;
      } while (pnVar6 != font->config);
      return font->fallback;
    }
  }
  return (nk_font_glyph *)0x0;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
int i = 0;
int count;
int total_glyphs = 0;
const struct nk_font_glyph *glyph = 0;
const struct nk_font_config *iter = 0;

NK_ASSERT(font);
NK_ASSERT(font->glyphs);
NK_ASSERT(font->info.ranges);
if (!font || !font->glyphs) return 0;

glyph = font->fallback;
iter = font->config;
do {count = nk_range_count(iter->range);
for (i = 0; i < count; ++i) {
nk_rune f = iter->range[(i*2)+0];
nk_rune t = iter->range[(i*2)+1];
int diff = (int)((t - f) + 1);
if (unicode >= f && unicode <= t)
return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
total_glyphs += diff;
}
} while ((iter = iter->n) != font->config);
return glyph;
}